

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  ArrayIndex AVar2;
  PathArgument *arg;
  pointer key;
  Value *other;
  
  key = (this->args_).super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
        _M_impl.super__Vector_impl_data._M_start;
  other = root;
  if (key != (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_finish) {
    do {
      if (key->kind_ == kindKey) {
        other = defaultValue;
        if (root->field_0x8 != '\a') break;
        root = Value::operator[](root,&key->key_);
        Value::nullSingleton();
        other = defaultValue;
        if (root == &Value::nullSingleton::nullStatic) break;
      }
      else if (key->kind_ == kindIndex) {
        other = defaultValue;
        if ((root->field_0x8 != '\x06') ||
           (uVar1 = key->index_, AVar2 = Value::size(root), other = defaultValue, AVar2 <= uVar1))
        break;
        root = Value::operator[](root,key->index_);
      }
      key = key + 1;
      other = root;
    } while (key != (this->args_).
                    super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  Value::Value(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}